

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void pugi::impl::(anonymous_namespace)::
     sort<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
               (xpath_node *begin,xpath_node *end,document_order_comparator *pred)

{
  xml_attribute_struct *pxVar1;
  xpath_node *pxVar2;
  bool bVar3;
  ulong uVar4;
  xpath_node *rhs;
  xpath_node *rhs_00;
  xpath_node *extraout_RDX;
  xpath_node *pxVar5;
  xpath_node *extraout_RDX_00;
  xpath_node *extraout_RDX_01;
  xpath_node *extraout_RDX_02;
  xpath_node *extraout_RDX_03;
  xpath_node *pxVar6;
  xpath_node *pxVar7;
  xpath_node *this;
  xpath_node val;
  xml_node_struct *local_68;
  xml_attribute_struct *pxStack_60;
  xpath_node *local_50;
  xpath_node *local_48;
  xpath_node local_40;
  
  uVar4 = (long)end - (long)begin >> 4;
  if (0x10 < (long)uVar4) {
    pxVar6 = begin;
    do {
      pxVar2 = (xpath_node *)(&pxVar6->_node + (uVar4 & 0xfffffffffffffffe));
      local_48 = end;
      bVar3 = anon_unknown_0::document_order_comparator::operator()
                        ((document_order_comparator *)pxVar2,pxVar6,(xpath_node *)pred);
      pxVar7 = pxVar2;
      pxVar5 = pxVar6;
      if (bVar3) {
        pxVar7 = pxVar6;
        pxVar5 = pxVar2;
      }
      bVar3 = anon_unknown_0::document_order_comparator::operator()
                        ((document_order_comparator *)(end + -1),pxVar7,rhs);
      if (bVar3) {
        pxVar7 = end + -1;
      }
      bVar3 = anon_unknown_0::document_order_comparator::operator()
                        ((document_order_comparator *)pxVar7,pxVar5,rhs_00);
      if (bVar3) {
        pxVar7 = pxVar5;
      }
      local_40._node._root = (pxVar7->_node)._root;
      local_40._attribute._attr = (pxVar7->_attribute)._attr;
      pxVar5 = extraout_RDX;
      pxVar7 = pxVar6;
      this = pxVar6;
      local_50 = end;
      pxVar2 = pxVar6;
      begin = end;
      if (pxVar6 < end) {
        do {
          bVar3 = anon_unknown_0::document_order_comparator::operator()
                            ((document_order_comparator *)this,&local_40,pxVar5);
          if (bVar3) {
            this = this + 1;
          }
          else if (((this->_node)._root == local_40._node._root) &&
                  ((this->_attribute)._attr == local_40._attribute._attr)) {
            local_68 = (pxVar7->_node)._root;
            pxStack_60 = (pxVar7->_attribute)._attr;
            pxVar1 = (this->_attribute)._attr;
            (pxVar7->_node)._root = (this->_node)._root;
            (pxVar7->_attribute)._attr = pxVar1;
            pxVar7 = pxVar7 + 1;
            (this->_node)._root = local_68;
            (this->_attribute)._attr = pxStack_60;
            this = this + 1;
          }
          else {
            local_68 = (this->_node)._root;
            pxStack_60 = (this->_attribute)._attr;
            pxVar1 = end[-1]._attribute._attr;
            (this->_node)._root = end[-1]._node._root;
            (this->_attribute)._attr = pxVar1;
            end[-1]._node._root = local_68;
            end[-1]._attribute._attr = pxStack_60;
            end = end + -1;
          }
          pxVar5 = extraout_RDX_00;
          begin = end;
        } while (this < end);
      }
      for (; pxVar7 != pxVar2; pxVar2 = pxVar2 + 1) {
        local_68 = (pxVar2->_node)._root;
        pxStack_60 = (pxVar2->_attribute)._attr;
        pxVar1 = end[-1]._attribute._attr;
        (pxVar2->_node)._root = end[-1]._node._root;
        (pxVar2->_attribute)._attr = pxVar1;
        end[-1]._node._root = local_68;
        end[-1]._attribute._attr = pxStack_60;
        end = end + -1;
      }
      if ((long)local_48 - (long)begin < (long)end - (long)pxVar6) {
        sort<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
                  (begin,local_50,(document_order_comparator *)pxVar5);
        pred = (document_order_comparator *)extraout_RDX_01;
        begin = pxVar6;
      }
      else {
        sort<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
                  (pxVar6,end,(document_order_comparator *)pxVar5);
        pred = (document_order_comparator *)extraout_RDX_02;
        end = local_50;
      }
      uVar4 = (long)end - (long)begin >> 4;
      pxVar6 = begin;
    } while (0x10 < (long)uVar4);
  }
  pxVar6 = begin + 1;
  if (pxVar6 != end && begin != end) {
    do {
      local_68 = (pxVar6->_node)._root;
      pxStack_60 = (pxVar6->_attribute)._attr;
      pxVar2 = pxVar6;
      while (begin < pxVar2) {
        pxVar5 = pxVar2 + -1;
        bVar3 = anon_unknown_0::document_order_comparator::operator()
                          ((document_order_comparator *)&local_68,pxVar5,(xpath_node *)pred);
        pred = (document_order_comparator *)extraout_RDX_03;
        if (!bVar3) break;
        pxVar1 = pxVar2[-1]._attribute._attr;
        (pxVar2->_node)._root = (pxVar5->_node)._root;
        (pxVar2->_attribute)._attr = pxVar1;
        pxVar2 = pxVar5;
      }
      (pxVar2->_node)._root = local_68;
      (pxVar2->_attribute)._attr = pxStack_60;
      pxVar6 = pxVar6 + 1;
    } while (pxVar6 != end);
  }
  return;
}

Assistant:

PUGI_IMPL_FN void sort(I begin, I end, const Pred& pred)
	{
		// sort large chunks
		while (end - begin > 16)
		{
			// find median element
			I middle = begin + (end - begin) / 2;
			I median = median3(begin, middle, end - 1, pred);

			// partition in three chunks (< = >)
			I eqbeg, eqend;
			partition3(begin, end, *median, pred, &eqbeg, &eqend);

			// loop on larger half
			if (eqbeg - begin > end - eqend)
			{
				sort(eqend, end, pred);
				end = eqbeg;
			}
			else
			{
				sort(begin, eqbeg, pred);
				begin = eqend;
			}
		}

		// insertion sort small chunk
		insertion_sort(begin, end, pred);
	}